

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::btSoftBody(btSoftBody *this,btSoftBodyWorldInfo *worldInfo)

{
  btVector3 *pbVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  btAlignedObjectArray<btSoftBody::Tetra> *in_stack_ffffffffffffff30;
  btTransform *this_00;
  btDbvt *in_stack_ffffffffffffff40;
  Pose *in_stack_ffffffffffffff50;
  btCollisionObject *in_stack_ffffffffffffff60;
  btVector3 *local_98;
  btSoftBody *this_01;
  
  btCollisionObject::btCollisionObject(in_stack_ffffffffffffff60);
  *in_RDI = &PTR__btSoftBody_002e8250;
  btAlignedObjectArray<const_btCollisionObject_*>::btAlignedObjectArray
            ((btAlignedObjectArray<const_btCollisionObject_*> *)in_stack_ffffffffffffff30);
  Config::Config((Config *)in_stack_ffffffffffffff50);
  Pose::Pose(in_stack_ffffffffffffff50);
  in_RDI[0x69] = in_RSI;
  btAlignedObjectArray<btSoftBody::Note>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Note> *)in_stack_ffffffffffffff30);
  this_01 = (btSoftBody *)(in_RDI + 0x6e);
  btAlignedObjectArray<btSoftBody::Node>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Node> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Link>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Link> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Face>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Face> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Tetra>::btAlignedObjectArray(in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Anchor>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Anchor> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::RContact>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::RContact> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::SContact>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::SContact> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Joint_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Joint_*> *)in_stack_ffffffffffffff30);
  btAlignedObjectArray<btSoftBody::Material_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Material_*> *)in_stack_ffffffffffffff30);
  local_98 = (btVector3 *)((long)in_RDI + 0x494);
  pbVar1 = (btVector3 *)((long)in_RDI + 0x4b4);
  do {
    btVector3::btVector3(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != pbVar1);
  btDbvt::btDbvt(in_stack_ffffffffffffff40);
  btDbvt::btDbvt(in_stack_ffffffffffffff40);
  btDbvt::btDbvt((btDbvt *)(in_RDI + 0xaf));
  btAlignedObjectArray<btSoftBody::Cluster_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btSoftBody::Cluster_*> *)in_stack_ffffffffffffff30);
  this_00 = (btTransform *)(in_RDI + 0xbf);
  btAlignedObjectArray<bool>::btAlignedObjectArray((btAlignedObjectArray<bool> *)this_00);
  btTransform::btTransform(this_00);
  btVector3::btVector3((btVector3 *)(in_RDI + 0xcb));
  btAlignedObjectArray<int>::btAlignedObjectArray((btAlignedObjectArray<int> *)this_00);
  initDefaults(this_01);
  return;
}

Assistant:

btSoftBody::btSoftBody(btSoftBodyWorldInfo*	worldInfo)
:m_worldInfo(worldInfo)
{
	initDefaults();
}